

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::collision::ChCollisionModelBullet::GetShapePos
          (ChCoordsys<double> *__return_storage_ptr__,ChCollisionModelBullet *this,int index)

{
  float fVar1;
  element_type *peVar2;
  cbtCompoundShapeChild *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined8 in_XMM1_Qb;
  cbtQuaternion cVar8;
  ChQuaternion<double> local_40;
  
  peVar2 = (this->bt_compound_shape).
           super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    if ((long)(this->super_ChCollisionModel).m_shapes.
              super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_ChCollisionModel).m_shapes.
              super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("m_shapes.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModelBullet.cpp"
                    ,0x35f,
                    "virtual ChCoordsys<> chrono::collision::ChCollisionModelBullet::GetShapePos(int) const"
                   );
    }
    if (index != 0) {
      __assert_fail("index == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModelBullet.cpp"
                    ,0x360,
                    "virtual ChCoordsys<> chrono::collision::ChCollisionModelBullet::GetShapePos(int) const"
                   );
    }
    (__return_storage_ptr__->pos).m_data[2] = 0.0;
    (__return_storage_ptr__->pos).m_data[0] = 0.0;
    (__return_storage_ptr__->pos).m_data[1] = 0.0;
    (__return_storage_ptr__->rot).m_data[0] = 1.0;
    (__return_storage_ptr__->rot).m_data[3] = 0.0;
    (__return_storage_ptr__->rot).m_data[1] = 0.0;
    (__return_storage_ptr__->rot).m_data[2] = 0.0;
  }
  else {
    auVar7 = ZEXT856(0);
    (__return_storage_ptr__->rot).m_data[0] = 1.0;
    (__return_storage_ptr__->rot).m_data[1] = 0.0;
    (__return_storage_ptr__->rot).m_data[2] = 0.0;
    (__return_storage_ptr__->rot).m_data[3] = 0.0;
    pcVar3 = (peVar2->m_children).m_data;
    cVar8 = cbtTransform::getRotation(&pcVar3[index].m_transform);
    auVar6._0_8_ = cVar8.super_cbtQuadWord.m_floats._0_8_;
    auVar6._8_56_ = auVar7;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)pcVar3[index].m_transform.m_origin.m_floats;
    auVar5 = vcvtps2pd_avx(auVar5);
    fVar1 = pcVar3[index].m_transform.m_origin.m_floats[2];
    *(undefined1 (*) [16])(__return_storage_ptr__->pos).m_data = auVar5;
    auVar5 = _DAT_00f47d50;
    (__return_storage_ptr__->pos).m_data[2] = (double)fVar1;
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = cVar8.super_cbtQuadWord.m_floats._8_8_;
    auVar5 = vpermi2ps_avx512vl(auVar5,auVar4,auVar6._0_16_);
    local_40.m_data = (double  [4])vcvtps2pd_avx(auVar5);
    ChQuaternion<double>::operator=(&__return_storage_ptr__->rot,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChCollisionModelBullet::GetShapePos(int index) const {
    if (!bt_compound_shape) {
        // if not using a compound, there must be a single centered shape
        assert(m_shapes.size() == 1);
        assert(index == 0);
        return ChCoordsys<>();
    }

    ChCoordsys<> csys;
    ChBulletToCoords(bt_compound_shape->getChildTransform(index), csys);

    return csys;
}